

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O3

value * __thiscall
mjs::string_object::get(value *__return_storage_ptr__,string_object *this,wstring_view *name)

{
  wstring_view s;
  gc_heap_ptr_untyped local_38;
  wstring_view local_28;
  
  local_28 = handle_array_like_access(this,*name);
  if (local_28._M_len == 0) {
    native_object::get(__return_storage_ptr__,&this->super_native_object,name);
  }
  else {
    string::string((string *)&local_38,(this->super_native_object).super_object.heap_,&local_28);
    __return_storage_ptr__->type_ = string;
    (__return_storage_ptr__->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped
    .heap_ = local_38.heap_;
    *(uint32_t *)((long)&__return_storage_ptr__->field_1 + 8) = local_38.pos_;
    if (local_38.heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_38.heap_,(gc_heap_ptr_untyped *)&(__return_storage_ptr__->field_1).s_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

value get(const std::wstring_view& name) const override {
        if (const auto s = handle_array_like_access(name); !s.empty()) {
            return value{string{heap(), s}};
        }
        return native_object::get(name);
    }